

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cc
# Opt level: O1

void __thiscall iqnet::Connect_processor::handle_output(Connect_processor *this,bool *terminate)

{
  network_error *this_00;
  int myerrno;
  string local_48;
  
  *terminate = true;
  myerrno = Socket::get_last_error(&this->sock);
  if ((myerrno != 0) && (myerrno != 0x73)) {
    Socket::close(&this->sock,(int)terminate);
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Connector","");
    network_error::network_error(this_00,&local_48,true,myerrno);
    __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void handle_output( bool& terminate )
  {
    terminate = true;
    int err = sock.get_last_error();

    if (err && err != IQXMLRPC_INPROGRESS) {
      sock.close();
      throw network_error("Connector", true, err);
    }
  }